

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

void Fxu_HeapSingleInsert(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  int iVar1;
  Fxu_Single *pSingle_local;
  Fxu_HeapSingle *p_local;
  
  if (p->nItems == p->nItemsAlloc) {
    Fxu_HeapSingleResize(p);
  }
  iVar1 = p->nItems + 1;
  p->nItems = iVar1;
  p->pTree[iVar1] = pSingle;
  pSingle->HNum = p->nItems;
  Fxu_HeapSingleMoveUp(p,pSingle);
  return;
}

Assistant:

void Fxu_HeapSingleInsert( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
	if ( p->nItems == p->nItemsAlloc )
		Fxu_HeapSingleResize( p );
	// put the last entry to the last place and move up
	p->pTree[++p->nItems] = pSingle;
	pSingle->HNum = p->nItems;
	// move the last entry up if necessary
	Fxu_HeapSingleMoveUp( p, pSingle );
}